

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat_tests.cpp
# Opt level: O0

void __thiscall
iu_ConcatTestCheck_x_iutest_x_P_Test::Body(iu_ConcatTestCheck_x_iutest_x_P_Test *this)

{
  iu_ConcatTestCheck_x_iutest_x_P_Test *this_local;
  
  ConcatTestCheckCount("P1/ConcatTest",4);
  ConcatTestCheckCount("P2/ConcatTest",4);
  ConcatTestCheckCount("P3/ConcatTest",4);
  ConcatTestCheckCount("P4/ConcatTest",3);
  ConcatTestCheckCount("P5/ConcatTest",0xd);
  return;
}

Assistant:

IUTEST(ConcatTestCheck, P)
{
    ConcatTestCheckCount("P1/ConcatTest", 2+2);
    ConcatTestCheckCount("P2/ConcatTest", 2+2);
    ConcatTestCheckCount("P3/ConcatTest", 2+2);
#if IUTEST_HAS_RANDOMVALUES
    ConcatTestCheckCount("P4/ConcatTest", 1+2);
#endif
    ConcatTestCheckCount("P5/ConcatTest", 9+2+2);
}